

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-tls.c
# Opt level: O0

void lws_tls_err_describe_clear(void)

{
  ulong e;
  unsigned_long l;
  char buf [160];
  
  do {
    e = ERR_get_error();
    if (e == 0) break;
    ERR_error_string_n(e,(char *)&l,0xa0);
    _lws_log(8,"   openssl error: %s\n",&l);
  } while (e != 0);
  _lws_log(8,"\n");
  return;
}

Assistant:

void
lws_tls_err_describe_clear(void)
{
	char buf[160];
	unsigned long l;

	do {
		l = ERR_get_error();
		if (!l)
			break;

		ERR_error_string_n(
#if defined(LWS_WITH_BORINGSSL)
				(uint32_t)
#endif
				l, buf, sizeof(buf));
		lwsl_info("   openssl error: %s\n", buf);
	} while (l);
	lwsl_info("\n");
}